

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

Element __thiscall ftxui::SliderBase<float>::Render(SliderBase<float> *this)

{
  Palette16 index;
  SliderBase<float> *pSVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Color *this_00;
  long lVar3;
  ComponentBase *in_RSI;
  ComponentBase *pCVar4;
  Element EVar5;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_00;
  float in_stack_fffffffffffffcfc;
  allocator_type local_2fc;
  allocator_type local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  SliderBase<float> *local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  Element local_2e8;
  Element local_2d8;
  Element local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  Element local_298;
  shared_ptr<ftxui::Node> local_288;
  ftxui local_278 [16];
  undefined1 local_268 [16];
  Element local_258;
  Element local_248;
  Color local_238;
  Color local_234;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_230;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_218;
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  Decorator local_1d0;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_1b0;
  string local_190 [32];
  Decorator local_170;
  string local_150 [32];
  string local_130 [32];
  Decorator gauge_color;
  code *local_f0 [2];
  code *local_e0;
  code *local_d8;
  code *local_d0 [2];
  code *local_c0;
  code *local_b8;
  code *local_b0 [2];
  code *local_a0;
  code *local_98;
  code *local_90 [2];
  code *local_80;
  code *local_78;
  code *local_70 [2];
  code *local_60;
  code *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  bVar2 = ComponentBase::Focused(in_RSI);
  if (bVar2) {
    this_00 = &local_234;
    index = GrayLight;
  }
  else {
    this_00 = &local_238;
    index = GrayDark;
  }
  Color::Color(this_00,index);
  color(*this_00);
  local_2f8 = (SliderBase<float> *)
              CONCAT44(local_2f8._4_4_,*(undefined4 *)in_RSI[2]._vptr_ComponentBase);
  local_2f0 = *(undefined4 *)
               &in_RSI[2].children_.
                super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_2ec = *(undefined4 *)
               ((long)&in_RSI[2].children_.
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  pCVar4 = in_RSI + 1;
  if (in_RSI[1].parent_ != (ComponentBase *)0x0) {
    pCVar4 = in_RSI[1].parent_;
  }
  std::__cxx11::string::string(local_130,(string *)pCVar4);
  text((string *)local_2a8);
  local_50[1] = (code *)0x0;
  local_50[0] = dim;
  local_38 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_298,(Element *)local_2a8,(Decorator *)local_50);
  local_70[1] = (code *)0x0;
  local_70[0] = vcenter;
  local_58 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_288,&local_298,(Decorator *)local_70);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"[",&local_2f9);
  text((string *)local_200);
  gauge(in_stack_fffffffffffffcfc);
  local_90[1] = (code *)0x0;
  local_90[0] = underlined;
  local_78 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  local_2f8 = this;
  operator|((ftxui *)&local_2d8,&local_2e8,(Decorator *)local_90);
  local_b0[1] = (code *)0x0;
  local_b0[0] = xflex;
  local_98 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_2c8,&local_2d8,(Decorator *)local_b0);
  reflect((Box *)((long)&in_RSI[2].parent_ + 4));
  operator|((ftxui *)(local_200 + 0x10),&local_2c8,&local_170);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"]",&local_2fa);
  text((string *)local_1e0);
  __l._M_len = 3;
  __l._M_array = (iterator)local_200;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_230,__l,&local_2fb);
  hbox((Elements *)local_2b8);
  local_d0[1] = (code *)0x0;
  local_d0[0] = xflex;
  local_b8 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|(local_278,(Element *)local_2b8,(Decorator *)local_d0);
  __l_00._M_len = 2;
  __l_00._M_array = &local_288;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_218,__l_00,&local_2fc);
  hbox((Elements *)local_268);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
            (&local_1b0,&gauge_color);
  operator|((ftxui *)&local_258,(Element *)local_268,&local_1b0);
  local_f0[1] = (code *)0x0;
  local_f0[0] = xflex;
  local_d8 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_248,&local_258,(Decorator *)local_f0);
  reflect((Box *)((long)&in_RSI[2].children_.
                         super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4));
  pSVar1 = local_2f8;
  operator|((ftxui *)local_2f8,&local_248,(Decorator *)(local_1e0 + 0x10));
  std::_Function_base::~_Function_base((_Function_base *)(local_1e0 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_258.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&local_1b0.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8));
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_218);
  lVar3 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_288.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  std::_Function_base::~_Function_base((_Function_base *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 8));
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_230);
  lVar3 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  std::__cxx11::string::~string(local_190);
  std::_Function_base::~_Function_base(&local_170.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_150);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a8 + 8));
  std::__cxx11::string::~string(local_130);
  std::_Function_base::~_Function_base(&gauge_color.super__Function_base);
  EVar5.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar5.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pSVar1;
  return (Element)EVar5.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() {
    auto gauge_color =
        Focused() ? color(Color::GrayLight) : color(Color::GrayDark);
    float percent = float(*value_ - min_) / float(max_ - min_);
    return hbox({
               text(*label_) | dim | vcenter,
               hbox({
                   text("["),
                   gauge(percent) | underlined | xflex | reflect(gauge_box_),
                   text("]"),
               }) | xflex,
           }) |
           gauge_color | xflex | reflect(box_);
  }